

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls.cpp
# Opt level: O0

int __thiscall QDtls::shutdown(QDtls *this,int __fd,int __how)

{
  long lVar1;
  pointer s;
  ulong uVar2;
  pointer pDVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  DtlsCryptograph *backend;
  QDtlsPrivate *d;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  char *c;
  char *in_stack_ffffffffffffff78;
  undefined1 local_39;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QDtls *)0x3baeb0);
  s = std::
      unique_ptr<QTlsPrivate::DtlsCryptograph,_std::default_delete<QTlsPrivate::DtlsCryptograph>_>::
      get((unique_ptr<QTlsPrivate::DtlsCryptograph,_std::default_delete<QTlsPrivate::DtlsCryptograph>_>
           *)0x3baec3);
  if (s == (pointer)0x0) {
    local_39 = 0;
  }
  else if (CONCAT44(in_register_00000034,__fd) == 0) {
    lVar1 = *(long *)(*(long *)s + -0x60);
    tr(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    (**(code **)(*(long *)(s + lVar1) + 0x10))(s + lVar1,1,local_20);
    QString::~QString((QString *)0x3baf44);
    local_39 = 0;
  }
  else {
    uVar2 = (**(code **)(*(long *)s + 0x98))();
    if ((uVar2 & 1) == 0) {
      c = *(char **)(*(long *)s + -0x60);
      pDVar3 = s + (long)c;
      tr((char *)s,c,in_stack_ffffffffffffff6c);
      (**(code **)(*(long *)(s + (long)c) + 0x10))(pDVar3,2,local_38);
      QString::~QString((QString *)0x3bafc2);
      local_39 = 0;
    }
    else {
      (**(code **)(*(long *)s + 200))(s,CONCAT44(in_register_00000034,__fd));
      local_39 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_39);
  }
  __stack_chk_fail();
}

Assistant:

bool QDtls::shutdown(QUdpSocket *socket)
{
    Q_D(QDtls);

    auto *backend = d->backend.get();
    if (!backend)
        return false;

    if (!socket) {
        backend->setDtlsError(QDtlsError::InvalidInputParameters,
                              tr("Invalid (nullptr) socket"));
        return false;
    }

    if (!backend->isConnectionEncrypted()) {
        backend->setDtlsError(QDtlsError::InvalidOperation,
                              tr("Cannot send shutdown alert, not encrypted"));
        return false;
    }

    backend->sendShutdownAlert(socket);
    return true;
}